

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ft_font_renderer.cpp
# Opt level: O2

void refLib(void)

{
  int err;
  FontRendererError *this;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  libRefCount = libRefCount + 1;
  if (libRefCount < 2) {
    err = FT_Init_FreeType(&library);
    if (err != 0) {
      this = (FontRendererError *)__cxa_allocate_exception(0x10);
      ftErrorToStr_abi_cxx11_(&sStack_58,err);
      std::operator+(&local_38,"Error initializing FreeType: ",&sStack_58);
      dpfb::FontRendererError::runtime_error(this,&local_38);
      __cxa_throw(this,&dpfb::FontRendererError::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return;
}

Assistant:

static void refLib()
{
    ++libRefCount;
    if (libRefCount > 1)
        return;

    auto err = FT_Init_FreeType(&library);
    if (err != FT_Err_Ok)
        throw dpfb::FontRendererError(
            "Error initializing FreeType: " + ftErrorToStr(err));
}